

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

bool __thiscall
nuraft::snapshot_io_mgr::push(snapshot_io_mgr *this,ptr<snapshot_io_mgr::io_queue_elem> *elem)

{
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *this_00;
  size_t *psVar1;
  element_type *peVar2;
  element_type *peVar3;
  long *plVar4;
  int iVar5;
  _Node *p_Var6;
  _List_node_base *p_Var7;
  string local_50;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_lock_);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  peVar2 = (elem->
           super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (peVar2->raft_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar4 = (long *)(peVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
  this_00 = &this->queue_;
  p_Var7 = (this->queue_).
           super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var7 == (_List_node_base *)this_00) {
      p_Var6 = std::__cxx11::
               list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
               ::_M_create_node<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>const&>
                         ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                           *)this_00,elem);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &(this->queue_).
                super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (plVar4 != (long *)0x0) {
        iVar5 = (**(code **)(*plVar4 + 0x38))(plVar4);
        if (5 < iVar5) {
          msg_if_given_abi_cxx11_
                    (&local_50,"added snapshot request for peer %d",
                     (ulong)*(uint *)(((((elem->
                                         super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->dst_).
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          (**(code **)(*plVar4 + 0x40))
                    (plVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                     ,"push",0x5d,&local_50);
LAB_0015852e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
LAB_0015859e:
      pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
      return p_Var7 == (_List_node_base *)this_00;
    }
    if (((element_type *)(p_Var7[1]._M_next)->_M_next == peVar3) &&
       (**(int **)p_Var7[1]._M_next[3]._M_next ==
        ((((peVar2->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_))
    {
      if (plVar4 == (long *)0x0) goto LAB_0015859e;
      iVar5 = (**(code **)(*plVar4 + 0x38))(plVar4);
      if (iVar5 < 6) goto LAB_0015859e;
      msg_if_given_abi_cxx11_
                (&local_50,"snapshot request for peer %d already exists, do nothing",
                 (ulong)*(uint *)(((((elem->
                                     super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->dst_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      (**(code **)(*plVar4 + 0x40))
                (plVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                 ,"push",0x58,&local_50);
      goto LAB_0015852e;
    }
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

bool snapshot_io_mgr::push(ptr<snapshot_io_mgr::io_queue_elem>& elem) {
    auto_lock(queue_lock_);
    logger* l_ = elem->raft_->l_.get();

    // If there is existing one for the same peer, ignore it.
    for (auto& entry: queue_) {
        if ( entry->raft_ == elem->raft_ &&
             entry->dst_->get_id() == elem->dst_->get_id() ) {
            p_tr("snapshot request for peer %d already exists, do nothing",
                 elem->dst_->get_id());
            return false;
        }
    }
    queue_.push_back(elem);
    p_tr("added snapshot request for peer %d", elem->dst_->get_id());

    return true;
}